

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControlLabel::mouseReleaseEvent(ControlLabel *this,QMouseEvent *mouseEvent)

{
  MouseButton MVar1;
  QSinglePointEvent *in_RSI;
  long in_RDI;
  
  MVar1 = QSinglePointEvent::button(in_RSI);
  if (MVar1 == LeftButton) {
    if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
      *(undefined1 *)(in_RDI + 0x40) = 0;
      _q_clicked((ControlLabel *)0x62b10d);
    }
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  return;
}

Assistant:

void ControlLabel::mouseReleaseEvent(QMouseEvent *mouseEvent)
{
    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }
    if (isPressed) {
        isPressed = false;
        emit _q_clicked();
    }
}